

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::SecretDirectorySetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  pointer pSVar1;
  string sStack_38;
  
  pSVar1 = unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>,_true>::
           operator->(&config->secret_manager);
  Value::ToString_abi_cxx11_(&sStack_38,input);
  (*pSVar1->_vptr_SecretManager[8])(pSVar1,&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void SecretDirectorySetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	config.secret_manager->SetPersistentSecretPath(input.ToString());
}